

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::match_divide(Token *__return_storage_ptr__,Lexer *this)

{
  Type local_3c;
  TokenPosition local_38;
  
  local_38.super_Position._vptr_Position =
       (_func_int **)((ulong)local_38.super_Position._vptr_Position & 0xffffffffffffff00);
  consume(this,(bool *)&local_38);
  if (this->current_ == '*') {
    local_38.super_Position._vptr_Position =
         (_func_int **)CONCAT71(local_38.super_Position._vptr_Position._1_7_,1);
    consume(this,(bool *)&local_38);
    this->in_block_comment_ = true;
    local_3c = kLeftBlockComment;
  }
  else {
    if (this->current_ != '/') {
      local_3c = kDivide;
      local_38.super_Position.row_ = (this->position_).super_Position.row_;
      local_38.super_Position.col_ = (this->position_).super_Position.col_;
      local_38.length_ = 1;
      goto LAB_0012d6b1;
    }
    local_38.super_Position._vptr_Position =
         (_func_int **)CONCAT71(local_38.super_Position._vptr_Position._1_7_,1);
    consume(this,(bool *)&local_38);
    this->in_row_comment_ = true;
    local_3c = kLineComment;
  }
  local_38.super_Position.row_ = (this->position_).super_Position.row_;
  local_38.super_Position.col_ = (this->position_).super_Position.col_;
  local_38.length_ = 2;
LAB_0012d6b1:
  local_38.super_Position._vptr_Position = (_func_int **)&PTR_clear_001599f0;
  Token::Token(__return_storage_ptr__,&local_3c,&local_38);
  return __return_storage_ptr__;
}

Assistant:

Token Lexer::match_divide() {
    consume(false);
    if (current_ == '/') {
        consume();
        in_row_comment_ = true;
        return Token(Token::Type::kLineComment, TokenPosition(position_, 2));
    } else if (current_ == '*') {
        consume();
        in_block_comment_ = true;
        return Token(Token::Type::kLeftBlockComment, TokenPosition(position_, 2));
    } else {
        return Token(Token::Type::kDivide, TokenPosition(position_, 1));
    }
}